

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_text_file_contents(char *filename,wchar_t line,char *buff,char *fn)

{
  char cVar1;
  char cVar2;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  char *p;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  wchar_t wVar9;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    wVar9 = L'\0';
    failure_start(filename,line,"File doesn\'t exist: %s",fn);
    failure_finish((void *)0x0);
  }
  else {
    sVar4 = strlen(buff);
    iVar3 = (int)sVar4;
    p = (char *)malloc((long)(iVar3 * 2 + 0x80));
    sVar4 = fread(p,1,(long)(iVar3 * 2 + 0x7f),__stream);
    uVar7 = (uint)sVar4;
    if (-1 < (int)uVar7) {
      p[uVar7 & 0x7fffffff] = '\0';
    }
    fclose(__stream);
    pcVar5 = p;
    pcVar6 = buff;
    while( true ) {
      cVar1 = *pcVar6;
      cVar2 = *pcVar5;
      if (cVar1 == '\0') break;
      if ((cVar2 == '\0') ||
         ((lVar8 = 1, cVar1 != cVar2 &&
          (((cVar1 != '\n' || (cVar2 != '\r')) || (lVar8 = 2, pcVar5[1] != '\n'))))))
      goto LAB_001167ae;
      pcVar5 = pcVar5 + lVar8;
      pcVar6 = pcVar6 + 1;
    }
    if (cVar2 == '\0') {
      free(p);
      wVar9 = L'\x01';
    }
    else {
LAB_001167ae:
      wVar9 = L'\0';
      failure_start(filename,line,"Contents don\'t match");
      logprintf("  file=\"%s\"\n",fn);
      if ((int)uVar7 < 1) {
        pcVar6 = "  File empty, contents should be:\n";
        pcVar5 = (char *)0x0;
      }
      else {
        hexdump(p,buff,(ulong)(uVar7 & 0x7fffffff),0);
        pcVar6 = "  expected\n";
        pcVar5 = p;
      }
      logprintf(pcVar6);
      hexdump(buff,pcVar5,(long)iVar3,0);
      failure_finish((void *)0x0);
      free(p);
    }
  }
  return wVar9;
}

Assistant:

int
assertion_text_file_contents(const char *filename, int line, const char *buff, const char *fn)
{
	char *contents;
	const char *btxt, *ftxt;
	FILE *f;
	int n, s;

	assertion_count(filename, line);
	f = fopen(fn, "r");
	if (f == NULL) {
		failure_start(filename, line,
		    "File doesn't exist: %s", fn);
		failure_finish(NULL);
		return (0);
	}
	s = (int)strlen(buff);
	contents = malloc(s * 2 + 128);
	n = (int)fread(contents, 1, s * 2 + 128 - 1, f);
	if (n >= 0)
		contents[n] = '\0';
	fclose(f);
	/* Compare texts. */
	btxt = buff;
	ftxt = (const char *)contents;
	while (*btxt != '\0' && *ftxt != '\0') {
		if (*btxt == *ftxt) {
			++btxt;
			++ftxt;
			continue;
		}
		if (btxt[0] == '\n' && ftxt[0] == '\r' && ftxt[1] == '\n') {
			/* Pass over different new line characters. */
			++btxt;
			ftxt += 2;
			continue;
		}
		break;
	}
	if (*btxt == '\0' && *ftxt == '\0') {
		free(contents);
		return (1);
	}
	failure_start(filename, line, "Contents don't match");
	logprintf("  file=\"%s\"\n", fn);
	if (n > 0) {
		hexdump(contents, buff, n, 0);
		logprintf("  expected\n");
		hexdump(buff, contents, s, 0);
	} else {
		logprintf("  File empty, contents should be:\n");
		hexdump(buff, NULL, s, 0);
	}
	failure_finish(NULL);
	free(contents);
	return (0);
}